

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall chaiscript::dispatch::Bound_Function::~Bound_Function(Bound_Function *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pTVar1;
  
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            (&this->m_args);
  this_00 = (this->m_f).
            super___shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_Proxy_Function_Base)._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_003212f8;
  pTVar1 = (this->super_Proxy_Function_Base).m_types.
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)(this->super_Proxy_Function_Base).m_types.
                                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pTVar1);
  }
  operator_delete(this,0x50);
  return;
}

Assistant:

Bound_Function(const Const_Proxy_Function &t_f, const std::vector<Boxed_Value> &t_args)
          : Proxy_Function_Base(build_param_type_info(t_f, t_args),
                                (t_f->get_arity() < 0 ? -1 : static_cast<int>(build_param_type_info(t_f, t_args).size()) - 1))
          , m_f(t_f)
          , m_args(t_args) {
        assert(m_f->get_arity() < 0 || m_f->get_arity() == static_cast<int>(m_args.size()));
      }